

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

int readIdentifier(char firstChar)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  int c;
  uint uVar4;
  uint16_t uVar5;
  ulong uVar6;
  
  cVar2 = firstChar + -0x20;
  if (firstChar < 'a') {
    cVar2 = firstChar;
  }
  uVar5 = keywordDict[0].children[(byte)(cVar2 - 0x20)];
  uVar4 = firstChar == '.' | 0x4a;
  uVar6 = 1;
  yylval.symName[0] = firstChar;
  while( true ) {
    c = peek();
    bVar3 = continuesIdentifier(c);
    if (!bVar3) break;
    shiftChar();
    if (uVar6 < 0xff) {
      yylval.symName[uVar6] = (char)c;
      if (c == 0x2e) {
        uVar4 = 0x4b;
      }
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        iVar1 = c + -0x20;
        if ((char)c < 'a') {
          iVar1 = c;
        }
        uVar5 = keywordDict[uVar5].children[(byte)((char)iVar1 - 0x20)];
      }
    }
    uVar6 = uVar6 + 1;
  }
  if (0xff < uVar6) {
    warning(WARNING_LONG_STR,"Symbol name too long, got truncated\n");
    uVar6 = 0xff;
  }
  yylval.symName[uVar6] = '\0';
  if (keywordDict[uVar5].keyword != (KeywordMapping *)0x0) {
    uVar4 = (keywordDict[uVar5].keyword)->token;
  }
  return uVar4;
}

Assistant:

static int readIdentifier(char firstChar)
{
	// Lex while checking for a keyword
	yylval.symName[0] = firstChar;
	uint16_t nodeID = keywordDict[0].children[dictIndex(firstChar)];
	int tokenType = firstChar == '.' ? T_LOCAL_ID : T_ID;
	size_t i = 1;

	// Continue reading while the char is in the symbol charset
	for (int c = peek(); continuesIdentifier(c); i++, c = peek()) {
		shiftChar();

		if (i < sizeof(yylval.symName) - 1) {
			// Write the char to the identifier's name
			yylval.symName[i] = c;

			// If the char was a dot, mark the identifier as local
			if (c == '.')
				tokenType = T_LOCAL_ID;

			// Attempt to traverse the tree to check for a keyword
			if (nodeID) // Do nothing if matching already failed
				nodeID = keywordDict[nodeID].children[dictIndex(c)];
		}
	}

	if (i > sizeof(yylval.symName) - 1) {
		warning(WARNING_LONG_STR, "Symbol name too long, got truncated\n");
		i = sizeof(yylval.symName) - 1;
	}
	yylval.symName[i] = '\0'; // Terminate the string

	if (keywordDict[nodeID].keyword)
		return keywordDict[nodeID].keyword->token;

	return tokenType;
}